

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprpc.cpp
# Opt level: O3

void __thiscall mprpc::MpRpcClient::do_send_heartbeat(MpRpcClient *this)

{
  atomic<int> *paVar1;
  element_type *peVar2;
  size_t sVar3;
  int iVar4;
  char *pcVar5;
  uint64_t val;
  uchar d;
  MsgPackPacker pk;
  MsgPackPacker pk_params;
  char local_79;
  MsgPackPacker local_78;
  MsgPackPacker local_48;
  
  iVar4 = (*((this->m_conn).super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_Connection[7])();
  if ((char)iVar4 != '\0') {
    LOCK();
    paVar1 = &this->m_cur_callid;
    iVar4 = (paVar1->super___atomic_base<int>)._M_i;
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
    UNLOCK();
    local_48.pk.data = &local_48;
    local_48.sb.size = 0;
    local_48.sb.data = (char *)0x0;
    local_48.sb.alloc = 0;
    local_48.pk.callback = msgpack_sbuffer_write;
    pcVar5 = (char *)malloc(0x2000);
    if (pcVar5 != (char *)0x0) {
      local_48.sb.alloc = 0x2000;
      *pcVar5 = -0x7f;
      local_48.sb.size = 1;
      local_48.sb.data = pcVar5;
    }
    val = std::chrono::_V2::system_clock::now();
    MsgPackPacker::pack_map_item(&local_48,"time",val);
    local_78.pk.data = &local_78;
    local_78.sb.size = 0;
    local_78.sb.data = (char *)0x0;
    local_78.sb.alloc = 0;
    local_78.pk.callback = msgpack_sbuffer_write;
    pcVar5 = (char *)malloc(0x2000);
    if (pcVar5 != (char *)0x0) {
      local_78.sb.alloc = 0x2000;
      *pcVar5 = -0x7d;
      local_78.sb.size = 1;
      local_78.sb.data = pcVar5;
    }
    MsgPackPacker::pack_map_item(&local_78,"id",iVar4 + 1);
    MsgPackPacker::pack_map_item(&local_78,"method",".sys.heartbeat");
    pcVar5 = local_48.sb.data;
    sVar3 = local_48.sb.size;
    local_79 = -0x5a;
    (*local_78.pk.callback)(local_78.pk.data,&local_79,1);
    (*local_78.pk.callback)(local_78.pk.data,"params",6);
    (*local_78.pk.callback)(local_78.pk.data,pcVar5,sVar3);
    peVar2 = (this->m_conn).super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar2->_vptr_Connection[5])(peVar2,local_78.sb.data,local_78.sb.size);
    free(local_78.sb.data);
    free(local_48.sb.data);
  }
  return;
}

Assistant:

void MpRpcClient::do_send_heartbeat()
    {
        if (!m_conn->is_connected()) return;

        int callid = ++m_cur_callid;

        MsgPackPacker pk_params;
        pk_params.pack_map(1);
        pk_params.pack_map_item("time", (uint64_t)system_clock::now().time_since_epoch().count());
         
        MsgPackPacker pk;
        pk.pack_map(3);
        pk.pack_map_item    ("id",     callid);
        pk.pack_map_item    ("method", ".sys.heartbeat");
        pk.pack_map_item_obj("params", pk_params.sb.data, pk_params.sb.size);

        m_conn->send(pk.sb.data, pk.sb.size);
    }